

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCopier.cxx
# Opt level: O0

bool __thiscall
cmFileCopier::InstallFile
          (cmFileCopier *this,string *fromFile,string *toFile,MatchProperties match_properties)

{
  cmCommand *pcVar1;
  bool bVar2;
  bool bVar3;
  ostream *poVar4;
  mode_t local_3f4;
  mode_t local_384;
  undefined1 local_380 [4];
  mode_t permissions;
  ostringstream local_360 [8];
  ostringstream e_1;
  mode_t local_1e4;
  undefined1 local_1e0 [4];
  mode_t perm;
  ostringstream local_1b0 [8];
  ostringstream e;
  bool copy;
  string *toFile_local;
  string *fromFile_local;
  cmFileCopier *this_local;
  mode_t mStack_10;
  MatchProperties match_properties_local;
  
  bVar2 = true;
  if ((this->Always & 1U) == 0) {
    bVar2 = cmFileTimeCache::DifferS(&this->FileTimes,fromFile,toFile);
  }
  (*this->_vptr_cmFileCopier[4])(this,toFile,0,(ulong)bVar2);
  if ((bVar2 == false) || (bVar3 = cmsys::SystemTools::CopyAFile(fromFile,toFile,true), bVar3)) {
    if ((bVar2 != false) && ((this->Always & 1U) == 0)) {
      local_1e4 = 0;
      bVar2 = cmsys::SystemTools::GetPermissions(toFile,&local_1e4);
      if (bVar2) {
        cmsys::SystemTools::SetPermissions(toFile,local_1e4 | 0x80,false);
      }
      bVar2 = cmSystemTools::CopyFileTime(fromFile,toFile);
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream(local_360);
        poVar4 = std::operator<<((ostream *)local_360,this->Name);
        poVar4 = std::operator<<(poVar4," cannot set modification time on \"");
        poVar4 = std::operator<<(poVar4,(string *)toFile);
        std::operator<<(poVar4,"\"");
        pcVar1 = &this->FileCommand->super_cmCommand;
        std::__cxx11::ostringstream::str();
        cmCommand::SetError(pcVar1,(string *)local_380);
        std::__cxx11::string::~string((string *)local_380);
        std::__cxx11::ostringstream::~ostringstream(local_360);
        return false;
      }
    }
    mStack_10 = match_properties.Permissions;
    if (mStack_10 == 0) {
      local_3f4 = this->FilePermissions;
    }
    else {
      local_3f4 = mStack_10;
    }
    local_384 = local_3f4;
    if (local_3f4 == 0) {
      cmsys::SystemTools::GetPermissions(fromFile,&local_384);
    }
    match_properties_local._3_1_ = SetPermissions(this,toFile,local_384);
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_1b0);
    poVar4 = std::operator<<((ostream *)local_1b0,this->Name);
    poVar4 = std::operator<<(poVar4," cannot copy file \"");
    poVar4 = std::operator<<(poVar4,(string *)fromFile);
    poVar4 = std::operator<<(poVar4,"\" to \"");
    poVar4 = std::operator<<(poVar4,(string *)toFile);
    std::operator<<(poVar4,"\".");
    pcVar1 = &this->FileCommand->super_cmCommand;
    std::__cxx11::ostringstream::str();
    cmCommand::SetError(pcVar1,(string *)local_1e0);
    std::__cxx11::string::~string((string *)local_1e0);
    match_properties_local._3_1_ = 0;
    std::__cxx11::ostringstream::~ostringstream(local_1b0);
  }
  return (bool)match_properties_local._3_1_;
}

Assistant:

bool cmFileCopier::InstallFile(const std::string& fromFile,
                               const std::string& toFile,
                               MatchProperties match_properties)
{
  // Determine whether we will copy the file.
  bool copy = true;
  if (!this->Always) {
    // If both files exist with the same time do not copy.
    if (!this->FileTimes.DifferS(fromFile, toFile)) {
      copy = false;
    }
  }

  // Inform the user about this file installation.
  this->ReportCopy(toFile, TypeFile, copy);

  // Copy the file.
  if (copy && !cmSystemTools::CopyAFile(fromFile, toFile, true)) {
    std::ostringstream e;
    e << this->Name << " cannot copy file \"" << fromFile << "\" to \""
      << toFile << "\".";
    this->FileCommand->SetError(e.str());
    return false;
  }

  // Set the file modification time of the destination file.
  if (copy && !this->Always) {
    // Add write permission so we can set the file time.
    // Permissions are set unconditionally below anyway.
    mode_t perm = 0;
    if (cmSystemTools::GetPermissions(toFile, perm)) {
      cmSystemTools::SetPermissions(toFile, perm | mode_owner_write);
    }
    if (!cmSystemTools::CopyFileTime(fromFile, toFile)) {
      std::ostringstream e;
      e << this->Name << " cannot set modification time on \"" << toFile
        << "\"";
      this->FileCommand->SetError(e.str());
      return false;
    }
  }

  // Set permissions of the destination file.
  mode_t permissions =
    (match_properties.Permissions ? match_properties.Permissions
                                  : this->FilePermissions);
  if (!permissions) {
    // No permissions were explicitly provided but the user requested
    // that the source file permissions be used.
    cmSystemTools::GetPermissions(fromFile, permissions);
  }
  return this->SetPermissions(toFile, permissions);
}